

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O1

void Js::CrossSite::MarshalCrossSite_TTDInflate(DynamicObject *obj)

{
  Type *pTVar1;
  JavascriptLibrary *this;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptFunction *function;
  DynamicTypeHandler *pDVar5;
  
  (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x62])();
  pTVar1 = (obj->super_RecyclableObject).type.ptr;
  if (pTVar1->typeId != TypeIds_Function) {
    return;
  }
  if ((((((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
        super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
      defaultAccessorFunction.ptr == (JavascriptFunction *)obj) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0xcf,
                                "(obj != obj->GetScriptContext()->GetLibrary()->GetDefaultAccessorFunction())"
                                ,
                                "default accessor marshalled -- I don\'t think this should ever happen as it is marshalled in a special case?"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  function = VarTo<Js::JavascriptFunction,Js::DynamicObject>(obj);
  pDVar5 = DynamicObject::GetTypeHandler(&function->super_DynamicObject);
  this = (((function->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
  if ((pDVar5->flags & 4) == 0) {
    JavascriptFunction::SetEntryPoint
              (function,((this->super_JavascriptLibraryBase).scriptContext.ptr)->
                        CurrentCrossSiteThunk);
    return;
  }
  JavascriptLibrary::SetCrossSiteForLockedFunctionType(this,function);
  return;
}

Assistant:

void CrossSite::MarshalCrossSite_TTDInflate(DynamicObject* obj)
    {
        obj->MarshalCrossSite_TTDInflate();

        if(obj->GetTypeId() == TypeIds_Function)
        {
            AssertMsg(obj != obj->GetScriptContext()->GetLibrary()->GetDefaultAccessorFunction(), "default accessor marshalled -- I don't think this should ever happen as it is marshalled in a special case?");
            JavascriptFunction * function = VarTo<JavascriptFunction>(obj);

            //
            //TODO: what happens if the gaurd in marshal (MarshalDynamicObject) isn't true?
            //

            if(function->GetTypeHandler()->GetIsLocked())
            {
                function->GetLibrary()->SetCrossSiteForLockedFunctionType(function);
            }
            else
            {
                function->SetEntryPoint(function->GetScriptContext()->CurrentCrossSiteThunk);
            }
        }
    }